

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

int set_scaling_proc(Am_Object *self)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Am_Value *pAVar6;
  Am_Wrapper *pAVar7;
  ushort uVar8;
  Am_Feature_Vector feat;
  Am_Point_List pl;
  Am_Point_List arrow_pl;
  Am_Point_List AStack_88;
  Am_Feature_Vector local_78 [8];
  Am_Point_List local_70;
  Am_Object local_60;
  float local_58;
  float local_54;
  Am_Point_List local_50;
  Am_Point_List local_40;
  Am_Point_List local_30;
  
  pAVar6 = (Am_Value *)Am_Object::Get(0x540,0x66);
  iVar2 = Am_Value::operator_cast_to_int(pAVar6);
  pAVar6 = (Am_Value *)Am_Object::Get(0x540,0x67);
  iVar3 = Am_Value::operator_cast_to_int(pAVar6);
  uVar8 = (ushort)self;
  pAVar6 = (Am_Value *)Am_Object::Get(uVar8,(ulong)(ushort)EXAMPLE_FEATURES);
  Am_Feature_Vector::Am_Feature_Vector(local_78,pAVar6);
  Am_Point_List::Am_Point_List(&local_70);
  Am_Point_List::Am_Point_List(&local_50);
  cVar1 = Am_Feature_Vector::Valid();
  if (cVar1 != '\0') {
    Am_Feature_Vector::Points();
    Am_Point_List::operator=(&local_70,&AStack_88);
    Am_Point_List::~Am_Point_List(&AStack_88);
  }
  Am_Point_List::Am_Point_List(&local_30,&local_70);
  compute_arrowhead(&AStack_88);
  Am_Point_List::operator=(&local_50,&AStack_88);
  Am_Point_List::~Am_Point_List(&AStack_88);
  Am_Point_List::~Am_Point_List(&local_30);
  cVar1 = Am_Point_List::Valid();
  if (cVar1 != '\0') {
    pAVar6 = (Am_Value *)Am_Object::Get(uVar8,0x66);
    iVar4 = Am_Value::operator_cast_to_int(pAVar6);
    pAVar6 = (Am_Value *)Am_Object::Get(uVar8,0x67);
    iVar5 = Am_Value::operator_cast_to_int(pAVar6);
    local_54 = (float)iVar4 / (float)iVar2;
    local_58 = (float)iVar5 / (float)iVar3;
    Am_Point_List::Scale(local_54,local_58,(int)&local_70,0,false);
    Am_Point_List::Scale(local_54,local_58,(int)&local_50,0,false);
  }
  Am_Object::Get_Object((ushort)&AStack_88,(ulong)self);
  pAVar7 = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_70);
  Am_Object::Set((ushort)&AStack_88,(Am_Wrapper *)0xb2,(ulong)pAVar7);
  Am_Object::~Am_Object((Am_Object *)&AStack_88);
  Am_Object::Get_Object((ushort)&local_60,(ulong)self);
  Am_Point_List::Am_Point_List(&local_40,&local_70);
  compute_arrowhead(&AStack_88);
  pAVar7 = Am_Point_List::operator_cast_to_Am_Wrapper_(&AStack_88);
  Am_Object::Set((ushort)&local_60,(Am_Wrapper *)0xb2,(ulong)pAVar7);
  Am_Point_List::~Am_Point_List(&AStack_88);
  Am_Point_List::~Am_Point_List(&local_40);
  Am_Object::~Am_Object(&local_60);
  Am_Point_List::~Am_Point_List(&local_50);
  Am_Point_List::~Am_Point_List(&local_70);
  Am_Feature_Vector::~Am_Feature_Vector(local_78);
  return 1;
}

Assistant:

Am_Define_Formula(int, set_scaling)
{
  int view_width = gesture_frame.Get(Am_WIDTH);
  int view_height = gesture_frame.Get(Am_HEIGHT);

  Am_Feature_Vector feat = self.Get(EXAMPLE_FEATURES);
  Am_Point_List pl, arrow_pl;

  if (feat.Valid())
    pl = feat.Points();

  arrow_pl = compute_arrowhead(pl);

  if (pl.Valid()) {
    float xscale = (float)(int)self.Get(Am_WIDTH) / view_width;
    float yscale = (float)(int)self.Get(Am_HEIGHT) / view_height;

    pl.Scale(xscale, yscale);
    arrow_pl.Scale(xscale, yscale);
  }

  self.Get_Object(EXAMPLE_STROKE).Set(Am_POINT_LIST, pl);
  self.Get_Object(EXAMPLE_ARROW).Set(Am_POINT_LIST, compute_arrowhead(pl));
  return 1;
}